

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void import_kernel_cmdline(int in_qemu)

{
  uint uVar1;
  int __fd;
  ssize_t sVar2;
  char *pcVar3;
  char *x;
  int n;
  int fd;
  char *ptr;
  char cmdline [1024];
  uint in_stack_fffffffffffffbdc;
  int local_418;
  char *local_410;
  char local_408 [1032];
  
  __fd = open("/proc/cmdline",0);
  if (__fd < 0) {
    local_408[0] = '\0';
  }
  else {
    sVar2 = read(__fd,local_408,0x3ff);
    local_418 = (int)sVar2;
    if (local_418 < 0) {
      local_418 = 0;
    }
    if ((0 < local_418) && (local_408[local_418 + -1] == '\n')) {
      local_418 = local_418 + -1;
    }
    local_408[local_418] = '\0';
    close(__fd);
  }
  local_410 = local_408;
  while( true ) {
    uVar1 = in_stack_fffffffffffffbdc & 0xffffff;
    if (local_410 != (char *)0x0) {
      uVar1 = CONCAT13(*local_410 != '\0',(int3)in_stack_fffffffffffffbdc);
    }
    in_stack_fffffffffffffbdc = uVar1;
    if ((char)(in_stack_fffffffffffffbdc >> 0x18) == '\0') break;
    pcVar3 = strchr(local_410,0x20);
    local_410 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      local_410 = pcVar3 + 1;
      *pcVar3 = '\0';
    }
    import_kernel_nv(local_410,in_stack_fffffffffffffbdc);
  }
  chmod("/proc/cmdline",0x120);
  return;
}

Assistant:

static void import_kernel_cmdline(int in_qemu)
{
    char cmdline[1024];
    char *ptr;
    int fd;

    fd = open("/proc/cmdline", O_RDONLY);
    if (fd >= 0) {
        int n = read(fd, cmdline, 1023);
        if (n < 0) n = 0;

        /* get rid of trailing newline, it happens */
        if (n > 0 && cmdline[n-1] == '\n') n--;

        cmdline[n] = 0;
        close(fd);
    } else {
        cmdline[0] = 0;
    }

    ptr = cmdline;
    while (ptr && *ptr) {
        char *x = strchr(ptr, ' ');
        if (x != 0) *x++ = 0;
        import_kernel_nv(ptr, in_qemu);
        ptr = x;
    }

        /* don't expose the raw commandline to nonpriv processes */
    chmod("/proc/cmdline", 0440);
}